

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O2

uint8_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
tagsOffset(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,uint8_t *start)

{
  char cVar1;
  byte *pbVar2;
  uint8_t uVar3;
  
  uVar3 = '\0';
  while( true ) {
    if ((*start & 0xfe) != 0xee) break;
    pbVar2 = start + 9;
    cVar1 = '\t';
    if (*start == 0xee) {
      cVar1 = '\x02';
      pbVar2 = start + 2;
    }
    uVar3 = cVar1 + uVar3;
    start = pbVar2;
  }
  return uVar3;
}

Assistant:

uint8_t tagsOffset(uint8_t const* start) const noexcept {
    uint8_t ret = 0;

    while (SliceStaticData::TypeMap[*start] == ValueType::Tagged) {
      uint8_t offset = tagOffset(start);
      VELOCYPACK_ASSERT(offset != 0);
      if (VELOCYPACK_UNLIKELY(offset == 0)) {
        // prevent endless loop
        break;
      }
      ret += offset;
      start += offset;
    }

    return ret;
  }